

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int cmsys::anon_unknown_3::NameValue<long_long>
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,string *name,longlong *value)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  string local_1e0 [32];
  istringstream local_1c0 [8];
  istringstream is;
  size_t at;
  size_t i;
  size_t nLines;
  longlong *value_local;
  string *name_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(lines);
  at = 0;
  while( true ) {
    if (sVar1 <= at) {
      return -1;
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](lines,at);
    lVar3 = std::__cxx11::string::find((string *)pvVar2,(ulong)name);
    if (lVar3 != -1) break;
    at = at + 1;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](lines,at);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_1e0,(ulong)pvVar2);
  std::__cxx11::istringstream::istringstream(local_1c0,local_1e0,_S_in);
  std::__cxx11::string::~string(local_1e0);
  std::istream::operator>>(local_1c0,value);
  std::__cxx11::istringstream::~istringstream(local_1c0);
  return 0;
}

Assistant:

int NameValue(std::vector<std::string> const& lines, std::string const& name,
              T& value)
{
  size_t nLines = lines.size();
  for (size_t i = 0; i < nLines; ++i) {
    size_t at = lines[i].find(name);
    if (at == std::string::npos) {
      continue;
    }
    std::istringstream is(lines[i].substr(at + name.size()));
    is >> value;
    return 0;
  }
  return -1;
}